

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O1

LY_ERR lys_parse_id(char **id)

{
  char cVar1;
  byte bVar2;
  LY_ERR LVar3;
  byte *pbVar4;
  
  if (*id == (char *)0x0) {
    __assert_fail("id && *id",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/ly_common.c"
                  ,0x32b,"LY_ERR lys_parse_id(const char **)");
  }
  cVar1 = **id;
  if (((byte)(cVar1 + 0x9fU) < 0x1a) ||
     (LVar3 = LY_EINVAL, cVar1 == '_' || (byte)(cVar1 + 0xbfU) < 0x1a)) {
    pbVar4 = (byte *)*id;
    do {
      do {
        pbVar4 = pbVar4 + 1;
        *id = (char *)pbVar4;
        bVar2 = *pbVar4;
      } while ((byte)(bVar2 - 0x30) < 10);
    } while (((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a) ||
            ((bVar2 - 0x2d < 0x33 && ((0x4000000000003U >> ((ulong)(bVar2 - 0x2d) & 0x3f) & 1) != 0)
             )));
    LVar3 = LY_SUCCESS;
  }
  return LVar3;
}

Assistant:

static LY_ERR
lys_parse_id(const char **id)
{
    assert(id && *id);

    if (!is_yangidentstartchar(**id)) {
        return LY_EINVAL;
    }
    ++(*id);

    while (is_yangidentchar(**id)) {
        ++(*id);
    }
    return LY_SUCCESS;
}